

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.cpp
# Opt level: O0

void __thiscall Sampler::Sampler(Sampler *this,int texUnit)

{
  ostream *poVar1;
  void *this_00;
  int texUnit_local;
  Sampler *this_local;
  
  OGLStateObject::OGLStateObject(&this->super_OGLStateObject);
  (this->super_OGLStateObject)._vptr_OGLStateObject = (_func_int **)&PTR_bind_0020fa98;
  this->m_location = 0;
  this->m_texUnit = texUnit;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Failure in file ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/glApi.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  this_00 = (void *)std::ostream::operator<<(poVar1,0xd3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Sampler::Sampler(int)");
  poVar1 = std::operator<<(poVar1,
                           ": You must complete the implementation (look at the documentation in the header)"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

Sampler::Sampler(int texUnit) : m_location(0), m_texUnit(texUnit)
{
  FAIL_BECAUSE_INCOMPLETE;
}